

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O0

bool duckdb::DecimalCastOperation::
     TruncateExcessiveDecimals<duckdb::DecimalCastData<duckdb::hugeint_t>,true>
               (DecimalCastData<duckdb::hugeint_t> *state)

{
  DecimalCastData<duckdb::hugeint_t> *in_RDI;
  hugeint_t mod;
  idx_t i;
  bool round_up;
  DecimalCastData<duckdb::hugeint_t> *in_stack_ffffffffffffffa0;
  int64_t in_stack_ffffffffffffffa8;
  hugeint_t *in_stack_ffffffffffffffb0;
  hugeint_t *in_stack_ffffffffffffffb8;
  hugeint_t *in_stack_ffffffffffffffc0;
  hugeint_t *in_stack_ffffffffffffffc8;
  hugeint_t *in_stack_ffffffffffffffd0;
  ulong local_18;
  bool local_9;
  
  local_9 = false;
  for (local_18 = 0; local_18 < in_RDI->excessive_decimals; local_18 = local_18 + 1) {
    in_stack_ffffffffffffffa0 = in_RDI;
    hugeint_t::hugeint_t(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    hugeint_t::operator%(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    hugeint_t::hugeint_t(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    local_9 = hugeint_t::operator<=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    hugeint_t::hugeint_t(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    hugeint_t::operator/=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  if ((in_RDI->exponent_type == POSITIVE) && (local_9 != false)) {
    RoundUpResult<duckdb::DecimalCastData<duckdb::hugeint_t>,true>(in_stack_ffffffffffffffa0);
  }
  in_RDI->decimal_count = in_RDI->scale;
  return true;
}

Assistant:

static bool TruncateExcessiveDecimals(T &state) {
		D_ASSERT(state.excessive_decimals);
		bool round_up = false;
		for (idx_t i = 0; i < state.excessive_decimals; i++) {
			auto mod = state.result % 10;
			round_up = NEGATIVE ? mod <= -5 : mod >= 5;
			state.result /= static_cast<typename T::StoreType>(10.0);
		}
		//! Only round up when exponents are involved
		if (state.exponent_type == ExponentType::POSITIVE && round_up) {
			RoundUpResult<T, NEGATIVE>(state);
		}
		D_ASSERT(state.decimal_count > state.scale);
		state.decimal_count = state.scale;
		return true;
	}